

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O0

void nite::addRenderList(Renderable *object)

{
  Renderable *object_local;
  
  if (currentBatch == (Batch *)0x0) {
    object->target = ::target;
    RenderTarget::add(targets + ::target,object);
  }
  else {
    object->target = 0xb;
    Batch::add(currentBatch,object);
  }
  return;
}

Assistant:

void nite::addRenderList(Renderable *object){
	if(currentBatch != NULL){
		object->target = nite::RenderTargetDummy;
		currentBatch->add(object);
		return;
	}
	object->target = target;
	targets[target].add(object);
}